

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_odd_multiples_table_storage_var
               (int n,secp256k1_ge_storage *pre,secp256k1_gej *a)

{
  secp256k1_ge_storage *a_00;
  secp256k1_fe *b;
  secp256k1_fe_storage *r;
  undefined4 in_register_0000003c;
  secp256k1_fe_storage *psVar1;
  long lVar2;
  bool bVar3;
  secp256k1_fe dx_over_dz_squared;
  secp256k1_gej pj;
  secp256k1_gej d;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe zr;
  secp256k1_fe zi;
  secp256k1_ge d_ge;
  secp256k1_ge local_2b8;
  secp256k1_fe local_258;
  secp256k1_gej local_228;
  secp256k1_gej local_1a8;
  secp256k1_fe local_128;
  secp256k1_fe local_100;
  secp256k1_fe local_d8;
  secp256k1_fe local_b0;
  secp256k1_ge local_88;
  
  psVar1 = (secp256k1_fe_storage *)CONCAT44(in_register_0000003c,n);
  secp256k1_gej_double_var(&local_1a8,(secp256k1_gej *)pre,(secp256k1_fe *)0x0);
  local_88.x.n[4] = local_1a8.x.n[4];
  local_88.x.n[2] = local_1a8.x.n[2];
  local_88.x.n[3] = local_1a8.x.n[3];
  local_88.x.n[0] = local_1a8.x.n[0];
  local_88.x.n[1] = local_1a8.x.n[1];
  local_88.y.n[0] = local_1a8.y.n[0];
  local_88.y.n[1] = local_1a8.y.n[1];
  local_88.y.n[2] = local_1a8.y.n[2];
  local_88.y.n[3] = local_1a8.y.n[3];
  local_88.y.n[4] = local_1a8.y.n[4];
  local_88.infinity = 0;
  secp256k1_ge_set_gej_zinv(&local_2b8,(secp256k1_gej *)pre,&local_1a8.z);
  local_228.x.n[4] = local_2b8.x.n[4];
  local_228.x.n[2] = local_2b8.x.n[2];
  local_228.x.n[3] = local_2b8.x.n[3];
  local_228.x.n[0] = local_2b8.x.n[0];
  local_228.x.n[1] = local_2b8.x.n[1];
  local_228.y.n[0] = local_2b8.y.n[0];
  local_228.y.n[1] = local_2b8.y.n[1];
  local_228.y.n[2] = local_2b8.y.n[2];
  local_228.y.n[3] = local_2b8.y.n[3];
  local_228.y.n[4] = local_2b8.y.n[4];
  local_228.z.n[0] = pre[1].x.n[2];
  local_228.z.n[1] = pre[1].x.n[3];
  local_228.z.n[2] = pre[1].y.n[0];
  local_228.z.n[3] = pre[1].y.n[1];
  local_228.z.n[4] = pre[1].y.n[2];
  local_228.infinity = 0;
  lVar2 = 0x1fff;
  r = psVar1;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    secp256k1_fe_normalize_var(&local_228.y);
    secp256k1_fe_to_storage(r + 1,&local_228.y);
    secp256k1_gej_add_ge_var(&local_228,&local_228,&local_88,&local_d8);
    secp256k1_fe_normalize_var(&local_d8);
    secp256k1_fe_to_storage(r,&local_d8);
    r = r + 2;
  }
  b = &local_1a8.z;
  secp256k1_fe_mul(&local_b0,&local_228.z,b);
  secp256k1_fe_inv(&local_b0,&local_b0);
  secp256k1_ge_set_gej_zinv(&local_2b8,&local_228,&local_b0);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)(psVar1 + 0x3ffe),&local_2b8);
  secp256k1_fe_mul(b,&local_b0,&local_228.z);
  secp256k1_fe_sqr(&local_258,b);
  secp256k1_fe_mul(&local_258,&local_258,&local_1a8.x);
  for (lVar2 = 0x7ff80; lVar2 != -0x40; lVar2 = lVar2 + -0x40) {
    a_00 = (secp256k1_ge_storage *)((long)psVar1->n + lVar2);
    secp256k1_ge_from_storage(&local_2b8,a_00);
    secp256k1_fe_mul(&local_b0,&local_b0,&local_2b8.x);
    secp256k1_fe_sqr(&local_100,&local_b0);
    secp256k1_fe_mul(&local_128,&local_100,&local_b0);
    secp256k1_fe_mul(&local_2b8.x,&local_2b8.x,&local_100);
    local_2b8.x.n[0] = (local_258.n[0] - local_2b8.x.n[0]) + 0x3ffffbfffff0bc;
    local_2b8.x.n[1] = (local_258.n[1] - local_2b8.x.n[1]) + 0x3ffffffffffffc;
    local_2b8.x.n[2] = (local_258.n[2] - local_2b8.x.n[2]) + 0x3ffffffffffffc;
    local_2b8.x.n[3] = (local_258.n[3] - local_2b8.x.n[3]) + 0x3ffffffffffffc;
    local_2b8.x.n[4] = (local_258.n[4] - local_2b8.x.n[4]) + 0x3fffffffffffc;
    secp256k1_fe_mul(&local_2b8.y,&local_2b8.y,&local_128);
    secp256k1_ge_to_storage(a_00,&local_2b8);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table_storage_var(const int n, secp256k1_ge_storage *pre, const secp256k1_gej *a) {
    secp256k1_gej d;
    secp256k1_ge d_ge, p_ge;
    secp256k1_gej pj;
    secp256k1_fe zi;
    secp256k1_fe zr;
    secp256k1_fe dx_over_dz_squared;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /* First, we perform all the additions in an isomorphic curve obtained by multiplying
     * all `z` coordinates by 1/`d.z`. In these coordinates `d` is affine so we can use
     * `secp256k1_gej_add_ge_var` to perform the additions. For each addition, we store
     * the resulting y-coordinate and the z-ratio, since we only have enough memory to
     * store two field elements. These are sufficient to efficiently undo the isomorphism
     * and recompute all the `x`s.
     */
    d_ge.x = d.x;
    d_ge.y = d.y;
    d_ge.infinity = 0;

    secp256k1_ge_set_gej_zinv(&p_ge, a, &d.z);
    pj.x = p_ge.x;
    pj.y = p_ge.y;
    pj.z = a->z;
    pj.infinity = 0;

    for (i = 0; i < (n - 1); i++) {
        secp256k1_fe_normalize_var(&pj.y);
        secp256k1_fe_to_storage(&pre[i].y, &pj.y);
        secp256k1_gej_add_ge_var(&pj, &pj, &d_ge, &zr);
        secp256k1_fe_normalize_var(&zr);
        secp256k1_fe_to_storage(&pre[i].x, &zr);
    }

    /* Invert d.z in the same batch, preserving pj.z so we can extract 1/d.z */
    secp256k1_fe_mul(&zi, &pj.z, &d.z);
    secp256k1_fe_inv_var(&zi, &zi);

    /* Directly set `pre[n - 1]` to `pj`, saving the inverted z-coordinate so
     * that we can combine it with the saved z-ratios to compute the other zs
     * without any more inversions. */
    secp256k1_ge_set_gej_zinv(&p_ge, &pj, &zi);
    secp256k1_ge_to_storage(&pre[n - 1], &p_ge);

    /* Compute the actual x-coordinate of D, which will be needed below. */
    secp256k1_fe_mul(&d.z, &zi, &pj.z);  /* d.z = 1/d.z */
    secp256k1_fe_sqr(&dx_over_dz_squared, &d.z);
    secp256k1_fe_mul(&dx_over_dz_squared, &dx_over_dz_squared, &d.x);

    /* Going into the second loop, we have set `pre[n-1]` to its final affine
     * form, but still need to set `pre[i]` for `i` in 0 through `n-2`. We
     * have `zi = (p.z * d.z)^-1`, where
     *
     *     `p.z` is the z-coordinate of the point on the isomorphic curve
     *           which was ultimately assigned to `pre[n-1]`.
     *     `d.z` is the multiplier that must be applied to all z-coordinates
     *           to move from our isomorphic curve back to secp256k1; so the
     *           product `p.z * d.z` is the z-coordinate of the secp256k1
     *           point assigned to `pre[n-1]`.
     *
     * All subsequent inverse-z-coordinates can be obtained by multiplying this
     * factor by successive z-ratios, which is much more efficient than directly
     * computing each one.
     *
     * Importantly, these inverse-zs will be coordinates of points on secp256k1,
     * while our other stored values come from computations on the isomorphic
     * curve. So in the below loop, we will take care not to actually use `zi`
     * or any derived values until we're back on secp256k1.
     */
    i = n - 1;
    while (i > 0) {
        secp256k1_fe zi2, zi3;
        const secp256k1_fe *rzr;
        i--;

        secp256k1_ge_from_storage(&p_ge, &pre[i]);

        /* For each remaining point, we extract the z-ratio from the stored
         * x-coordinate, compute its z^-1 from that, and compute the full
         * point from that. */
        rzr = &p_ge.x;
        secp256k1_fe_mul(&zi, &zi, rzr);
        secp256k1_fe_sqr(&zi2, &zi);
        secp256k1_fe_mul(&zi3, &zi2, &zi);
        /* To compute the actual x-coordinate, we use the stored z ratio and
         * y-coordinate, which we obtained from `secp256k1_gej_add_ge_var`
         * in the loop above, as well as the inverse of the square of its
         * z-coordinate. We store the latter in the `zi2` variable, which is
         * computed iteratively starting from the overall Z inverse then
         * multiplying by each z-ratio in turn.
         *
         * Denoting the z-ratio as `rzr`, we observe that it is equal to `h`
         * from the inside of the above `gej_add_ge_var` call. This satisfies
         *
         *    rzr = d_x * z^2 - x * d_z^2
         *
         * where (`d_x`, `d_z`) are Jacobian coordinates of `D` and `(x, z)`
         * are Jacobian coordinates of our desired point -- except both are on
         * the isomorphic curve that we were using when we called `gej_add_ge_var`.
         * To get back to secp256k1, we must multiply both `z`s by `d_z`, or
         * equivalently divide both `x`s by `d_z^2`. Our equation then becomes
         *
         *    rzr = d_x * z^2 / d_z^2 - x
         *
         * (The left-hand-side, being a ratio of z-coordinates, is unaffected
         * by the isomorphism.)
         *
         * Rearranging to solve for `x`, we have
         *
         *     x = d_x * z^2 / d_z^2 - rzr
         *
         * But what we actually want is the affine coordinate `X = x/z^2`,
         * which will satisfy
         *
         *     X = d_x / d_z^2 - rzr / z^2
         *       = dx_over_dz_squared - rzr * zi2
         */
        secp256k1_fe_mul(&p_ge.x, rzr, &zi2);
        secp256k1_fe_negate(&p_ge.x, &p_ge.x, 1);
        secp256k1_fe_add(&p_ge.x, &dx_over_dz_squared);
        /* y is stored_y/z^3, as we expect */
        secp256k1_fe_mul(&p_ge.y, &p_ge.y, &zi3);
        /* Store */
        secp256k1_ge_to_storage(&pre[i], &p_ge);
    }
}